

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O1

void ngx_str_rbtree_insert_value
               (ngx_rbtree_node_t *temp,ngx_rbtree_node_t *node,ngx_rbtree_node_t *sentinel)

{
  ulong uVar1;
  ulong __n;
  int iVar2;
  ngx_rbtree_node_t *pnVar3;
  bool bVar4;
  
  uVar1 = node->key;
  do {
    pnVar3 = temp;
    bVar4 = uVar1 < pnVar3->key;
    if (uVar1 == pnVar3->key) {
      __n = node[1].key;
      bVar4 = __n < pnVar3[1].key;
      if (__n == pnVar3[1].key) {
        iVar2 = memcmp(node[1].left,pnVar3[1].left,__n);
        bVar4 = SUB41((uint)iVar2 >> 0x1f,0);
      }
    }
    temp = (&pnVar3->left)[bVar4 ^ 1U];
  } while ((&pnVar3->left)[bVar4 ^ 1U] != sentinel);
  (&pnVar3->left)[bVar4 ^ 1U] = node;
  node->parent = pnVar3;
  node->left = sentinel;
  node->right = sentinel;
  node->color = '\x01';
  return;
}

Assistant:

void
ngx_str_rbtree_insert_value(ngx_rbtree_node_t *temp,
    ngx_rbtree_node_t *node, ngx_rbtree_node_t *sentinel)
{
    ngx_str_node_t      *n, *t;
    ngx_rbtree_node_t  **p;

    for ( ;; ) {

        n = (ngx_str_node_t *) node;
        t = (ngx_str_node_t *) temp;

        if (node->key != temp->key) {

            p = (node->key < temp->key) ? &temp->left : &temp->right;

        } else if (n->str.len != t->str.len) {

            p = (n->str.len < t->str.len) ? &temp->left : &temp->right;

        } else {
            p = (ngx_memcmp(n->str.data, t->str.data, n->str.len) < 0)
                 ? &temp->left : &temp->right;
        }

        if (*p == sentinel) {
            break;
        }

        temp = *p;
    }

    *p = node;
    node->parent = temp;
    node->left = sentinel;
    node->right = sentinel;
    ngx_rbt_red(node);
}